

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

string * QUtil::path_basename(string *__return_storage_ptr__,string *filename)

{
  ulong uVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + filename->_M_string_length);
  uVar4 = __return_storage_ptr__->_M_string_length;
  do {
    if (uVar4 < 2) {
      return __return_storage_ptr__;
    }
    uVar3 = std::__cxx11::string::find_last_of
                      ((char *)__return_storage_ptr__,0x27ea59,0xffffffffffffffff);
    uVar1 = uVar4 - 1;
    if (uVar3 == uVar1) {
      std::__cxx11::string::pop_back();
      uVar4 = uVar1;
    }
    else if (uVar3 != 0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
  } while (uVar3 == uVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::path_basename(std::string const& filename)
{
#ifdef _WIN32
    char const* pathsep = "/\\";
#else
    char const* pathsep = "/";
#endif
    std::string last = filename;
    auto len = last.length();
    while (len > 1) {
        auto pos = last.find_last_of(pathsep);
        if (pos == len - 1) {
            last.pop_back();
            --len;
        } else if (pos == std::string::npos) {
            break;
        } else {
            last = last.substr(pos + 1);
            break;
        }
    }
    return last;
}